

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall
QTreeViewPrivate::calcLogicalIndices
          (QTreeViewPrivate *this,QList<int> *logicalIndices,
          QList<QStyleOptionViewItem::ViewItemPosition> *itemPositions,int left,int right)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int logicalIndex;
  int iVar5;
  pointer pVVar6;
  ulong uVar7;
  int visualIndex;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ViewItemPosition VVar12;
  long in_FS_OFFSET;
  int local_5c;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = QHeaderView::count(this->header);
  iVar11 = left;
  do {
    local_5c = -1;
    if (iVar11 < 1) {
      logicalIndex = -1;
      break;
    }
    iVar11 = iVar11 + -1;
    logicalIndex = QHeaderView::logicalIndex(this->header,iVar11);
    bVar3 = QHeaderView::isSectionHidden(this->header,logicalIndex);
  } while (bVar3);
  iVar11 = local_5c;
  if (left < iVar4) {
    do {
      iVar11 = QHeaderView::logicalIndex(this->header,left);
      bVar3 = QHeaderView::isSectionHidden(this->header,iVar11);
      if (!bVar3) {
        if (right < left) break;
        local_3c = iVar11;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)logicalIndices,(logicalIndices->d).size,&local_3c);
        QList<int>::end(logicalIndices);
      }
      left = left + 1;
      iVar11 = local_5c;
    } while (iVar4 != left);
  }
  local_5c = iVar11;
  QList<QStyleOptionViewItem::ViewItemPosition>::resize(itemPositions,(logicalIndices->d).size);
  uVar7 = (logicalIndices->d).size;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      piVar2 = (logicalIndices->d).ptr;
      uVar9 = uVar8 + 1;
      iVar11 = local_5c;
      if (uVar9 < uVar7) {
        iVar11 = piVar2[uVar8 + 1];
      }
      iVar10 = logicalIndex;
      if (uVar8 != 0) {
        iVar10 = piVar2[uVar8 - 1];
      }
      VVar12 = OnlyOne;
      if ((((iVar4 != 1) && ((iVar1 = piVar2[uVar8], iVar11 != 0 || (iVar10 != -1)))) &&
          ((iVar1 != 0 || (iVar11 != -1)))) && (this->spanning == false)) {
        iVar5 = this->treePosition;
        if (iVar5 < 0) {
          iVar5 = QHeaderView::logicalIndex(this->header,0);
        }
        VVar12 = Beginning;
        if ((iVar5 != iVar1) && (iVar11 == 0 || iVar10 != -1)) {
          VVar12 = (iVar11 + 1U < 2) + Middle;
        }
      }
      pVVar6 = QList<QStyleOptionViewItem::ViewItemPosition>::data(itemPositions);
      pVVar6[uVar8] = VVar12;
      uVar7 = (logicalIndices->d).size;
      uVar8 = uVar9;
    } while (uVar9 < uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::calcLogicalIndices(
        QList<int> *logicalIndices, QList<QStyleOptionViewItem::ViewItemPosition> *itemPositions,
        int left, int right) const
{
    const int columnCount = header->count();
    /* 'left' and 'right' are the left-most and right-most visible visual indices.
       Compute the first visible logical indices before and after the left and right.
       We will use these values to determine the QStyleOptionViewItem::viewItemPosition. */
    int logicalIndexBeforeLeft = -1, logicalIndexAfterRight = -1;
    for (int visualIndex = left - 1; visualIndex >= 0; --visualIndex) {
        int logicalIndex = header->logicalIndex(visualIndex);
        if (!header->isSectionHidden(logicalIndex)) {
            logicalIndexBeforeLeft = logicalIndex;
            break;
        }
    }

    for (int visualIndex = left; visualIndex < columnCount; ++visualIndex) {
        int logicalIndex = header->logicalIndex(visualIndex);
        if (!header->isSectionHidden(logicalIndex)) {
            if (visualIndex > right) {
                logicalIndexAfterRight = logicalIndex;
                break;
            }
            logicalIndices->append(logicalIndex);
        }
    }

    itemPositions->resize(logicalIndices->size());
    for (int currentLogicalSection = 0; currentLogicalSection < logicalIndices->size(); ++currentLogicalSection) {
        const int headerSection = logicalIndices->at(currentLogicalSection);
        // determine the viewItemPosition depending on the position of column 0
        int nextLogicalSection = currentLogicalSection + 1 >= logicalIndices->size()
                                 ? logicalIndexAfterRight
                                 : logicalIndices->at(currentLogicalSection + 1);
        int prevLogicalSection = currentLogicalSection - 1 < 0
                                 ? logicalIndexBeforeLeft
                                 : logicalIndices->at(currentLogicalSection - 1);
        QStyleOptionViewItem::ViewItemPosition pos;
        if (columnCount == 1 || (nextLogicalSection == 0 && prevLogicalSection == -1)
            || (headerSection == 0 && nextLogicalSection == -1) || spanning)
            pos = QStyleOptionViewItem::OnlyOne;
        else if (isTreePosition(headerSection) || (nextLogicalSection != 0 && prevLogicalSection == -1))
            pos = QStyleOptionViewItem::Beginning;
        else if (nextLogicalSection == 0 || nextLogicalSection == -1)
            pos = QStyleOptionViewItem::End;
        else
            pos = QStyleOptionViewItem::Middle;
        (*itemPositions)[currentLogicalSection] = pos;
    }
}